

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadCamera(ColladaParser *this,Camera *pCamera)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ai_real aVar4;
  char *local_30;
  char *local_28;
  Camera *pCamera_local;
  ColladaParser *this_local;
  
  do {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"camera");
        if (bVar1) {
          SkipElement(this);
        }
        else {
          bVar1 = IsElement(this,"orthographic");
          if (bVar1) {
            pCamera->mOrtho = true;
          }
          else {
            bVar1 = IsElement(this,"xfov");
            if ((bVar1) || (bVar1 = IsElement(this,"xmag"), bVar1)) {
              aVar4 = ReadFloatFromTextContent(this);
              pCamera->mHorFov = aVar4;
              if ((pCamera->mOrtho & 1U) == 0) {
                local_28 = "xfov";
              }
              else {
                local_28 = "xmag";
              }
              TestClosing(this,local_28);
            }
            else {
              bVar1 = IsElement(this,"yfov");
              if ((bVar1) || (bVar1 = IsElement(this,"ymag"), bVar1)) {
                aVar4 = ReadFloatFromTextContent(this);
                pCamera->mVerFov = aVar4;
                if ((pCamera->mOrtho & 1U) == 0) {
                  local_30 = "yfov";
                }
                else {
                  local_30 = "ymag";
                }
                TestClosing(this,local_30);
              }
              else {
                bVar1 = IsElement(this,"aspect_ratio");
                if (bVar1) {
                  aVar4 = ReadFloatFromTextContent(this);
                  pCamera->mAspect = aVar4;
                  TestClosing(this,"aspect_ratio");
                }
                else {
                  bVar1 = IsElement(this,"znear");
                  if (bVar1) {
                    aVar4 = ReadFloatFromTextContent(this);
                    pCamera->mZNear = aVar4;
                    TestClosing(this,"znear");
                  }
                  else {
                    bVar1 = IsElement(this,"zfar");
                    if (bVar1) {
                      aVar4 = ReadFloatFromTextContent(this);
                      pCamera->mZFar = aVar4;
                      TestClosing(this,"zfar");
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"camera");
  } while (iVar3 != 0);
  return;
}

Assistant:

void ColladaParser::ReadCamera(Collada::Camera& pCamera)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("camera")) {
                SkipElement();
            }
            else if (IsElement("orthographic")) {
                pCamera.mOrtho = true;
            }
            else if (IsElement("xfov") || IsElement("xmag")) {
                pCamera.mHorFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "xmag" : "xfov"));
            }
            else if (IsElement("yfov") || IsElement("ymag")) {
                pCamera.mVerFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "ymag" : "yfov"));
            }
            else if (IsElement("aspect_ratio")) {
                pCamera.mAspect = ReadFloatFromTextContent();
                TestClosing("aspect_ratio");
            }
            else if (IsElement("znear")) {
                pCamera.mZNear = ReadFloatFromTextContent();
                TestClosing("znear");
            }
            else if (IsElement("zfar")) {
                pCamera.mZFar = ReadFloatFromTextContent();
                TestClosing("zfar");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "camera") == 0)
                break;
        }
    }
}